

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void statement(LexState *ls)

{
  l_uint32 *plVar1;
  byte bVar2;
  Dyndata *pDVar3;
  FuncState *pFVar4;
  Instruction *pIVar5;
  BlockCnt *pBVar6;
  undefined1 uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  TString *pTVar12;
  TString *pTVar13;
  lu_byte lVar14;
  ulong uVar15;
  Labeldesc *pLVar16;
  long lVar17;
  int iVar18;
  Dyndata *dyd;
  long lVar19;
  char *pcVar20;
  FuncState *pFVar21;
  lu_byte *plVar22;
  Vardesc *pVVar23;
  bool bVar24;
  BlockCnt bl1;
  int escapelist;
  undefined1 local_80 [8];
  undefined1 local_78 [24];
  FuncState *local_60;
  int local_54;
  FuncState *local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [2];
  undefined2 uStack_36;
  int local_34;
  
  iVar18 = ls->linenumber;
  luaE_incCstack(ls->L);
  iVar10 = (ls->t).token;
  switch(iVar10) {
  case 0x101:
    iVar18 = ls->linenumber;
    luaX_next(ls);
    pTVar12 = luaS_newlstr(ls->L,"break",5);
    iVar10 = luaK_jump(ls->fs);
    pDVar3 = ls->dyd;
    goto LAB_001496f7;
  case 0x102:
    luaX_next(ls);
    block(ls);
    check_match(ls,0x105,0x102,iVar18);
    break;
  case 0x103:
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x10b:
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x112:
  case 0x113:
  case 0x114:
    goto switchD_0014949c_caseD_103;
  case 0x107:
    pFVar21 = ls->fs;
    pDVar3 = pFVar21->ls->dyd;
    local_48._8_4_ = (pDVar3->label).n;
    local_48._12_4_ = (pDVar3->gt).n;
    _local_38 = CONCAT22(1,CONCAT11(0,pFVar21->nactvar));
    local_48._0_8_ = pFVar21->bl;
    if ((BlockCnt *)local_48._0_8_ == (BlockCnt *)0x0) {
      bVar24 = false;
    }
    else {
      bVar24 = ((BlockCnt *)local_48._0_8_)->insidetbc != '\0';
    }
    _local_38 = CONCAT13(bVar24,_local_38);
    pFVar21->bl = (BlockCnt *)local_48;
    luaX_next(ls);
    pTVar12 = str_checkname(ls);
    iVar10 = (ls->t).token;
    if ((iVar10 == 0x2c) || (iVar10 == 0x10b)) {
      pFVar4 = ls->fs;
      local_50 = (FuncState *)CONCAT44(local_50._4_4_,(uint)pFVar4->freereg);
      local_60 = pFVar21;
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13);
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13);
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13);
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13);
      new_localvar(ls,pTVar12);
      iVar10 = 1;
      while ((ls->t).token == 0x2c) {
        luaX_next(ls);
        pTVar12 = str_checkname(ls);
        new_localvar(ls,pTVar12);
        iVar10 = iVar10 + 1;
      }
      checknext(ls,0x10b);
      iVar9 = ls->linenumber;
      iVar11 = explist(ls,(expdesc *)local_80);
      adjust_assign((LexState *)ls->fs,4,iVar11,(expdesc *)local_80);
      adjustlocalvars(ls,4);
      pBVar6 = pFVar4->bl;
      pBVar6->upval = '\x01';
      pBVar6->insidetbc = '\x01';
      pFVar4->needclose = '\x01';
      luaK_checkstack(pFVar4,3);
      forbody(ls,(int)local_50,iVar9,iVar10,1);
      pFVar21 = local_60;
    }
    else {
      if (iVar10 != 0x3d) {
        pcVar20 = "\'=\' or \'in\' expected";
        goto LAB_0014a39c;
      }
      pFVar4 = ls->fs;
      local_60 = (FuncState *)CONCAT44(local_60._4_4_,(uint)pFVar4->freereg);
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13);
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13);
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13);
      new_localvar(ls,pTVar12);
      checknext(ls,0x3d);
      subexpr(ls,(expdesc *)local_80,0);
      luaK_exp2nextreg(ls->fs,(expdesc *)local_80);
      checknext(ls,0x2c);
      subexpr(ls,(expdesc *)local_80,0);
      luaK_exp2nextreg(ls->fs,(expdesc *)local_80);
      if ((ls->t).token == 0x2c) {
        luaX_next(ls);
        subexpr(ls,(expdesc *)local_80,0);
        luaK_exp2nextreg(ls->fs,(expdesc *)local_80);
      }
      else {
        luaK_int(pFVar4,(uint)pFVar4->freereg,1);
        luaK_reserveregs(pFVar4,1);
      }
      adjustlocalvars(ls,3);
      forbody(ls,(int)local_60,iVar18,1,0);
    }
    check_match(ls,0x105,0x107,iVar18);
    goto LAB_0014a231;
  case 0x108:
    luaX_next(ls);
    singlevar(ls,(expdesc *)local_80);
    while (iVar10 = (ls->t).token, iVar10 == 0x2e) {
      fieldsel(ls,(expdesc *)local_80);
    }
    if (iVar10 == 0x3a) {
      fieldsel(ls,(expdesc *)local_80);
    }
    body(ls,(expdesc *)local_48,(uint)(iVar10 == 0x3a),iVar18);
    check_readonly(ls,(expdesc *)local_80);
    luaK_storevar(ls->fs,(expdesc *)local_80,(expdesc *)local_48);
    luaK_fixline(ls->fs,iVar18);
    break;
  case 0x109:
    luaX_next(ls);
    pFVar21 = ls->fs;
    iVar18 = ls->linenumber;
    pTVar12 = str_checkname(ls);
    iVar10 = ls->fs->firstlabel;
    iVar9 = (ls->dyd->label).n;
    if (iVar10 < iVar9) {
      lVar19 = (long)iVar9 - (long)iVar10;
      plVar22 = &(ls->dyd->label).arr[iVar10].nactvar;
      do {
        if (((Labeldesc *)(plVar22 + -0x10))->name == pTVar12) {
          uVar15 = (ulong)*plVar22;
          goto LAB_0014a0c4;
        }
        plVar22 = plVar22 + 0x18;
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
    }
    iVar10 = luaK_jump(pFVar21);
    pDVar3 = ls->dyd;
LAB_001496f7:
    newlabelentry(ls,&pDVar3->gt,pTVar12,iVar18,iVar10);
    break;
  case 0x10a:
    local_60 = (FuncState *)CONCAT44(local_60._4_4_,iVar18);
    local_50 = ls->fs;
    local_54 = -1;
    do {
      pFVar21 = ls->fs;
      luaX_next(ls);
      subexpr(ls,(expdesc *)local_48,0);
      checknext(ls,0x112);
      if ((ls->t).token == 0x101) {
        iVar18 = ls->linenumber;
        luaK_goiffalse(ls->fs,(expdesc *)local_48);
        luaX_next(ls);
        local_78[0xb] = false;
        pDVar3 = pFVar21->ls->dyd;
        local_78._0_4_ = (pDVar3->label).n;
        local_78._4_4_ = (pDVar3->gt).n;
        local_80 = (undefined1  [8])pFVar21->bl;
        if (local_80 != (undefined1  [8])0x0) {
          local_78[0xb] = *(lu_byte *)((long)&(((LHS_assign *)local_80)->v).u + 3) != '\0';
        }
        local_78._9_2_ = 0;
        local_78[8] = pFVar21->nactvar;
        pFVar21->bl = (BlockCnt *)local_80;
        pTVar12 = luaS_newlstr(ls->L,"break",5);
        newlabelentry(ls,&ls->dyd->gt,pTVar12,iVar18,_local_38);
        while (iVar18 = (ls->t).token, iVar18 == 0x3b) {
          luaX_next(ls);
        }
        uVar8 = iVar18 - 0x103;
        if ((0x1d < uVar8) || ((0x20000007U >> (uVar8 & 0x1f) & 1) == 0)) {
          iVar18 = luaK_jump(pFVar21);
          goto LAB_001498e5;
        }
        leaveblock(pFVar21);
      }
      else {
        luaK_goiftrue(ls->fs,(expdesc *)local_48);
        local_78[0xb] = false;
        pDVar3 = pFVar21->ls->dyd;
        local_78._0_4_ = (pDVar3->label).n;
        local_78._4_4_ = (pDVar3->gt).n;
        local_80 = (undefined1  [8])pFVar21->bl;
        if (local_80 != (undefined1  [8])0x0) {
          local_78[0xb] = *(lu_byte *)((long)&(((LHS_assign *)local_80)->v).u + 3) != '\0';
        }
        local_78._9_2_ = 0;
        local_78[8] = pFVar21->nactvar;
        pFVar21->bl = (BlockCnt *)local_80;
        iVar18 = local_34;
LAB_001498e5:
        statlist(ls);
        leaveblock(pFVar21);
        if ((ls->t).token - 0x103U < 2) {
          iVar10 = luaK_jump(pFVar21);
          luaK_concat(pFVar21,&local_54,iVar10);
        }
        luaK_patchtohere(pFVar21,iVar18);
      }
      iVar18 = (ls->t).token;
    } while (iVar18 == 0x104);
    if (iVar18 == 0x103) {
      luaX_next(ls);
      block(ls);
    }
    check_match(ls,0x105,0x10a,(int)local_60);
    pFVar21 = local_50;
    iVar10 = local_54;
    goto LAB_00149ff3;
  case 0x10c:
    luaX_next(ls);
    if ((ls->t).token != 0x108) {
      pFVar21 = ls->fs;
      iVar18 = 0;
      iVar10 = -1;
      do {
        pTVar12 = str_checkname(ls);
        iVar9 = new_localvar(ls,pTVar12);
        if ((ls->t).token == 0x3c) {
          luaX_next(ls);
          pTVar12 = str_checkname(ls);
          pcVar20 = pTVar12->contents;
          checknext(ls,0x3e);
          iVar11 = strcmp(pcVar20,"const");
          if (iVar11 == 0) {
            uVar7 = 1;
            goto LAB_00149bd3;
          }
          iVar11 = strcmp(pcVar20,"close");
          if (iVar11 != 0) {
            pcVar20 = luaO_pushfstring(ls->L,"unknown attribute \'%s\'",pcVar20);
LAB_0014a35b:
            luaK_semerror(ls,pcVar20);
          }
          *(undefined1 *)
           ((long)(pFVar21->ls->dyd->actvar).arr +
           ((long)iVar9 + (long)pFVar21->firstlocal) * 0x18 + 9) = 2;
          if (iVar10 != -1) {
            luaK_semerror(ls,"multiple to-be-closed variables in local list");
          }
          iVar10 = (uint)pFVar21->nactvar + iVar18;
        }
        else {
          uVar7 = 0;
LAB_00149bd3:
          *(undefined1 *)
           ((long)(pFVar21->ls->dyd->actvar).arr +
           ((long)iVar9 + (long)pFVar21->firstlocal) * 0x18 + 9) = uVar7;
        }
        iVar11 = (ls->t).token;
        if (iVar11 != 0x2c) goto LAB_00149c07;
        luaX_next(ls);
        iVar18 = iVar18 + 1;
      } while( true );
    }
    luaX_next(ls);
    pFVar21 = ls->fs;
    bVar2 = pFVar21->nactvar;
    pTVar12 = str_checkname(ls);
    new_localvar(ls,pTVar12);
    adjustlocalvars(ls,1);
    body(ls,(expdesc *)local_80,0,ls->linenumber);
    pFVar21->f->locvars
    [*(short *)((long)(pFVar21->ls->dyd->actvar).arr +
               ((long)pFVar21->firstlocal + (ulong)bVar2) * 0x18 + 0xc)].startpc = pFVar21->pc;
    break;
  case 0x110:
    pFVar21 = ls->fs;
    iVar10 = luaK_getlabel(pFVar21);
    pDVar3 = pFVar21->ls->dyd;
    local_78._0_4_ = (pDVar3->label).n;
    local_78._4_4_ = (pDVar3->gt).n;
    local_78[9] = 0;
    local_78[8] = pFVar21->nactvar;
    local_78._10_2_ = 1;
    local_80 = (undefined1  [8])pFVar21->bl;
    if (local_80 == (undefined1  [8])0x0) {
      bVar24 = false;
    }
    else {
      bVar24 = *(lu_byte *)((long)&(((LHS_assign *)local_80)->v).u + 3) != '\0';
    }
    local_48._0_8_ = local_80;
    local_78[0xb] = bVar24;
    _local_38 = (uint3)pFVar21->nactvar;
    _local_38 = CONCAT13(bVar24,_local_38);
    pFVar21->bl = (BlockCnt *)local_48;
    local_48._8_4_ = local_78._0_4_;
    local_48._12_4_ = local_78._4_4_;
    luaX_next(ls);
    statlist(ls);
    check_match(ls,0x114,0x110,iVar18);
    iVar18 = cond(ls);
    leaveblock(pFVar21);
    if (local_38[1] != '\0') {
      iVar9 = luaK_jump(pFVar21);
      luaK_patchtohere(pFVar21,iVar18);
      uVar15 = (ulong)local_38[0];
      do {
        if ((int)uVar15 < 1) {
          iVar18 = 0;
          goto LAB_00149fff;
        }
        pVVar23 = (pFVar21->ls->dyd->actvar).arr;
        lVar19 = (long)pFVar21->firstlocal + uVar15;
        uVar15 = uVar15 - 1;
      } while (*(char *)((long)pVVar23 + lVar19 * 0x18 + -0xf) == '\x03');
      iVar18 = *(byte *)((long)pVVar23 + lVar19 * 0x18 + -0xe) + 1;
LAB_00149fff:
      luaK_codeABCk(pFVar21,OP_CLOSE,iVar18,0,0,0);
      iVar18 = luaK_jump(pFVar21);
      luaK_patchtohere(pFVar21,iVar9);
    }
    luaK_patchlist(pFVar21,iVar18,iVar10);
LAB_0014a231:
    leaveblock(pFVar21);
    break;
  case 0x111:
    luaX_next(ls);
    pFVar21 = ls->fs;
    uVar15 = (ulong)pFVar21->nactvar;
    do {
      if ((int)uVar15 < 1) {
        iVar18 = 0;
        goto LAB_00149a9a;
      }
      pVVar23 = (pFVar21->ls->dyd->actvar).arr;
      lVar19 = (long)pFVar21->firstlocal + uVar15;
      uVar15 = uVar15 - 1;
    } while (*(char *)((long)pVVar23 + lVar19 * 0x18 + -0xf) == '\x03');
    iVar18 = *(byte *)((long)pVVar23 + lVar19 * 0x18 + -0xe) + 1;
LAB_00149a9a:
    iVar10 = (ls->t).token;
    uVar8 = iVar10 - 0x103;
    if (((0x1d < uVar8) || (iVar9 = 0, (0x20020007U >> (uVar8 & 0x1f) & 1) == 0)) &&
       (iVar9 = 0, iVar10 != 0x3b)) {
      iVar9 = explist(ls,(expdesc *)local_80);
      if ((local_80._0_4_ & ~VNIL) == VCALL) {
        iVar10 = -1;
        luaK_setreturns(pFVar21,(expdesc *)local_80,-1);
        bVar24 = iVar9 == 1;
        iVar9 = iVar10;
        if (((bVar24) && (local_80._0_4_ == VCALL)) && (pFVar21->bl->insidetbc == '\0')) {
          pIVar5 = pFVar21->f->code;
          pIVar5[(int)local_78._0_4_] = pIVar5[(int)local_78._0_4_] & 0xffffff80 | 0x45;
        }
      }
      else if (iVar9 == 1) {
        iVar18 = luaK_exp2anyreg(pFVar21,(expdesc *)local_80);
        iVar9 = 1;
      }
      else {
        luaK_exp2nextreg(pFVar21,(expdesc *)local_80);
      }
    }
    luaK_ret(pFVar21,iVar18,iVar9);
    if ((ls->t).token != 0x3b) break;
LAB_00149ad1:
    luaX_next(ls);
    break;
  case 0x115:
    pFVar21 = ls->fs;
    luaX_next(ls);
    iVar9 = luaK_getlabel(pFVar21);
    iVar10 = cond(ls);
    pDVar3 = pFVar21->ls->dyd;
    local_78._0_4_ = (pDVar3->label).n;
    local_78._4_4_ = (pDVar3->gt).n;
    local_78[9] = 0;
    local_78[8] = pFVar21->nactvar;
    local_78._10_2_ = 1;
    local_80 = (undefined1  [8])pFVar21->bl;
    if (local_80 == (undefined1  [8])0x0) {
      bVar24 = false;
    }
    else {
      bVar24 = *(lu_byte *)((long)&(((LHS_assign *)local_80)->v).u + 3) != '\0';
    }
    local_78[0xb] = bVar24;
    pFVar21->bl = (BlockCnt *)local_80;
    checknext(ls,0x102);
    block(ls);
    iVar11 = luaK_jump(pFVar21);
    luaK_patchlist(pFVar21,iVar11,iVar9);
    check_match(ls,0x105,0x115,iVar18);
    leaveblock(pFVar21);
LAB_00149ff3:
    luaK_patchtohere(pFVar21,iVar10);
    break;
  default:
    if (iVar10 == 0x11f) {
      luaX_next(ls);
      pTVar12 = str_checkname(ls);
      checknext(ls,0x11f);
      while ((iVar10 = (ls->t).token, iVar10 == 0x11f || (iVar10 == 0x3b))) {
        statement(ls);
      }
      iVar9 = ls->fs->firstlabel;
      iVar11 = (ls->dyd->label).n;
      if (iVar9 < iVar11) {
        lVar19 = (long)iVar11 - (long)iVar9;
        pLVar16 = (ls->dyd->label).arr + iVar9;
        do {
          if (pLVar16->name == pTVar12) {
            pcVar20 = luaO_pushfstring(ls->L,"label \'%s\' already defined on line %d",
                                       pTVar12->contents,(ulong)(uint)pLVar16->line);
            goto LAB_0014a35b;
          }
          pLVar16 = pLVar16 + 1;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
      iVar9 = 1;
      if ((2 < iVar10 - 0x103U) && (iVar10 != 0x120)) {
        iVar9 = 0;
      }
      createlabel(ls,pTVar12,iVar18,iVar9);
      break;
    }
    if (iVar10 == 0x3b) goto LAB_00149ad1;
    goto switchD_0014949c_caseD_103;
  }
LAB_0014a239:
  pFVar21 = ls->fs;
  uVar15 = (ulong)pFVar21->nactvar;
  do {
    if ((int)uVar15 < 1) {
      lVar14 = '\0';
      goto LAB_0014a276;
    }
    pVVar23 = (pFVar21->ls->dyd->actvar).arr;
    lVar19 = (long)pFVar21->firstlocal + uVar15;
    uVar15 = uVar15 - 1;
  } while (*(char *)((long)pVVar23 + lVar19 * 0x18 + -0xf) == '\x03');
  lVar14 = *(char *)((long)pVVar23 + lVar19 * 0x18 + -0xe) + '\x01';
LAB_0014a276:
  pFVar21->freereg = lVar14;
  plVar1 = &ls->L->nCcalls;
  *plVar1 = *plVar1 - 1;
  return;
LAB_00149c07:
  if (iVar11 == 0x3d) {
    luaX_next(ls);
    iVar11 = explist(ls,(expdesc *)local_80);
  }
  else {
    local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffff00000000);
    iVar11 = 0;
  }
  if (((iVar11 + -1 == iVar18) &&
      (pVVar23 = (pFVar21->ls->dyd->actvar).arr + (long)iVar9 + (long)pFVar21->firstlocal,
      (pVVar23->vd).kind == '\x01')) &&
     (iVar9 = luaK_exp2const(pFVar21,(expdesc *)local_80,&pVVar23->k), iVar9 != 0)) {
    (pVVar23->vd).kind = '\x03';
    adjustlocalvars(ls,iVar18);
    pFVar21->nactvar = pFVar21->nactvar + '\x01';
  }
  else {
    adjust_assign((LexState *)ls->fs,iVar18 + 1,iVar11,(expdesc *)local_80);
    adjustlocalvars(ls,iVar18 + 1);
  }
  if (iVar10 != -1) {
    pBVar6 = pFVar21->bl;
    pBVar6->upval = '\x01';
    pBVar6->insidetbc = '\x01';
    pFVar21->needclose = '\x01';
    lVar19 = (long)(iVar10 + -1);
    do {
      if (iVar10 < 1) {
        iVar18 = 0;
        goto LAB_0014a294;
      }
      iVar10 = iVar10 + -1;
      pVVar23 = (pFVar21->ls->dyd->actvar).arr;
      lVar17 = pFVar21->firstlocal + lVar19;
      lVar19 = lVar19 + -1;
    } while (*(char *)((long)pVVar23 + lVar17 * 0x18 + 9) == '\x03');
    iVar18 = (&pVVar23->vd)[lVar17].ridx + 1;
LAB_0014a294:
    luaK_codeABCk(pFVar21,OP_TBC,iVar18,0,0,0);
  }
  goto LAB_0014a239;
  while( true ) {
    pVVar23 = (pFVar21->ls->dyd->actvar).arr;
    lVar19 = (long)pFVar21->firstlocal + uVar15;
    uVar15 = uVar15 - 1;
    if (*(char *)((long)pVVar23 + lVar19 * 0x18 + -0xf) != '\x03') break;
LAB_0014a0c4:
    if ((int)uVar15 < 1) {
      uVar8 = 0;
      goto LAB_0014a2ad;
    }
  }
  uVar8 = *(byte *)((long)pVVar23 + lVar19 * 0x18 + -0xe) + 1;
LAB_0014a2ad:
  uVar15 = (ulong)pFVar21->nactvar;
  do {
    if ((int)uVar15 < 1) goto LAB_0014a2fb;
    pVVar23 = (pFVar21->ls->dyd->actvar).arr;
    lVar19 = (long)pFVar21->firstlocal + uVar15;
    uVar15 = uVar15 - 1;
  } while (*(char *)((long)pVVar23 + lVar19 * 0x18 + -0xf) == '\x03');
  if (uVar8 <= *(byte *)((long)pVVar23 + lVar19 * 0x18 + -0xe)) {
    luaK_codeABCk(pFVar21,OP_CLOSE,uVar8,0,0,0);
  }
LAB_0014a2fb:
  iVar18 = luaK_jump(pFVar21);
  luaK_patchlist(pFVar21,iVar18,*(int *)(plVar22 + -8));
  goto LAB_0014a239;
switchD_0014949c_caseD_103:
  pFVar21 = ls->fs;
  suffixedexp(ls,(expdesc *)local_78);
  iVar18 = (ls->t).token;
  if ((iVar18 == 0x3d) || (iVar18 == 0x2c)) {
    local_80 = (undefined1  [8])0x0;
    restassign(ls,(LHS_assign *)local_80,1);
  }
  else {
    if (local_78._0_4_ != VCALL) {
      pcVar20 = "syntax error";
LAB_0014a39c:
      luaX_syntaxerror(ls,pcVar20);
    }
    *(undefined1 *)((long)pFVar21->f->code + (long)(int)local_78._8_4_ * 4 + 3) = 1;
  }
  goto LAB_0014a239;
}

Assistant:

static void statement (LexState *ls) {
  int line = ls->linenumber;  /* may be needed for error messages */
  enterlevel(ls);
  switch (ls->t.token) {
    case ';': {  /* stat -> ';' (empty statement) */
      luaX_next(ls);  /* skip ';' */
      break;
    }
    case TK_IF: {  /* stat -> ifstat */
      ifstat(ls, line);
      break;
    }
    case TK_WHILE: {  /* stat -> whilestat */
      whilestat(ls, line);
      break;
    }
    case TK_DO: {  /* stat -> DO block END */
      luaX_next(ls);  /* skip DO */
      block(ls);
      check_match(ls, TK_END, TK_DO, line);
      break;
    }
    case TK_FOR: {  /* stat -> forstat */
      forstat(ls, line);
      break;
    }
    case TK_REPEAT: {  /* stat -> repeatstat */
      repeatstat(ls, line);
      break;
    }
    case TK_FUNCTION: {  /* stat -> funcstat */
      funcstat(ls, line);
      break;
    }
    case TK_LOCAL: {  /* stat -> localstat */
      luaX_next(ls);  /* skip LOCAL */
      if (testnext(ls, TK_FUNCTION))  /* local function? */
        localfunc(ls);
      else
        localstat(ls);
      break;
    }
    case TK_DBCOLON: {  /* stat -> label */
      luaX_next(ls);  /* skip double colon */
      labelstat(ls, str_checkname(ls), line);
      break;
    }
    case TK_RETURN: {  /* stat -> retstat */
      luaX_next(ls);  /* skip RETURN */
      retstat(ls);
      break;
    }
    case TK_BREAK: {  /* stat -> breakstat */
      breakstat(ls);
      break;
    }
    case TK_GOTO: {  /* stat -> 'goto' NAME */
      luaX_next(ls);  /* skip 'goto' */
      gotostat(ls);
      break;
    }
    default: {  /* stat -> func | assignment */
      exprstat(ls);
      break;
    }
  }
  lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
             ls->fs->freereg >= luaY_nvarstack(ls->fs));
  ls->fs->freereg = luaY_nvarstack(ls->fs);  /* free registers */
  leavelevel(ls);
}